

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

BigInt * multiplicative_inverse(BigInt *__return_storage_ptr__,BigInt *e,BigInt *phi)

{
  bool bVar1;
  BigInt local_d8;
  undefined4 local_b4;
  BigInt local_b0;
  undefined1 local_90 [8];
  BigInt g;
  undefined1 local_60 [8];
  BigInt y;
  BigInt x;
  BigInt *phi_local;
  BigInt *e_local;
  
  BigInt::BigInt((BigInt *)&y.sign);
  BigInt::BigInt((BigInt *)local_60);
  extended_gcd((BigInt *)local_90,e,phi,(BigInt *)&y.sign,(BigInt *)local_60);
  BigInt::BigInt(&local_b0,1);
  bVar1 = BigInt::operator!=((BigInt *)local_90,&local_b0);
  BigInt::~BigInt(&local_b0);
  if (bVar1) {
    BigInt::BigInt(__return_storage_ptr__,0);
  }
  else {
    BigInt::operator+(&local_d8,(BigInt *)&y.sign,phi);
    BigInt::operator%(__return_storage_ptr__,&local_d8,phi);
    BigInt::~BigInt(&local_d8);
  }
  local_b4 = 1;
  BigInt::~BigInt((BigInt *)local_90);
  BigInt::~BigInt((BigInt *)local_60);
  BigInt::~BigInt((BigInt *)&y.sign);
  return __return_storage_ptr__;
}

Assistant:

BigInt multiplicative_inverse(const BigInt &e, const BigInt &phi) {
    BigInt x, y;
    BigInt g = extended_gcd(e, phi, x, y);
    if (g != BigInt(1))
        return BigInt(0);
    //throw invalid_argument("phi and public key pair have no multiplicative inverse");

    return (x + phi) % phi; //! for optimization and negatives
}